

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_interaction.cpp
# Opt level: O1

bool P_PoisonPlayer(player_t *player,AActor *poisoner,AActor *source,int poison)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  if ((player->cheats & 2U) == 0) {
    if ((player->cheats & 0x2000000U) == 0 &&
        ((player->mo->super_AActor).flags2.Value & 0x8000000) == 0) {
      if ((source != (AActor *)0x0) && (source->player != player)) {
        bVar1 = AActor::IsTeammate(&player->mo->super_AActor,source);
        if (bVar1) {
          poison = (int)((double)poison * level.teamdamage);
        }
      }
      bVar1 = true;
      if (0 < poison) {
        iVar3 = poison + player->poisoncount;
        player->poisoncount = iVar3;
        (player->poisoner).field_0.p = source;
        if (poisoner == (AActor *)0x0) {
          player->poisontype = 0;
          player->poisonpaintype = 0;
        }
        else {
          (player->poisontype).Index = (poisoner->DamageType).super_FName.Index;
          iVar2 = (poisoner->PainType).super_FName.Index;
          if (iVar2 == 0) {
            iVar2 = (poisoner->DamageType).super_FName.Index;
          }
          (player->poisonpaintype).Index = iVar2;
        }
        if (100 < iVar3) {
          player->poisoncount = 100;
        }
      }
    }
    else {
      bVar1 = false;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool P_PoisonPlayer (player_t *player, AActor *poisoner, AActor *source, int poison)
{
	if((player->cheats&CF_GODMODE) || (player->mo->flags2 & MF2_INVULNERABLE) || (player->cheats & CF_GODMODE2))
	{
		return false;
	}
	if (source != NULL && source->player != player && player->mo->IsTeammate (source))
	{
		poison = (int)(poison * level.teamdamage);
	}
	if (poison > 0)
	{
		player->poisoncount += poison;
		player->poisoner = source;
		if (poisoner == NULL)
		{
			player->poisontype = player->poisonpaintype = NAME_None;
		}
		else
		{ // We need to record these in case the poisoner disappears before poisoncount reaches 0.
			player->poisontype = poisoner->DamageType;
			player->poisonpaintype = poisoner->PainType != NAME_None ? poisoner->PainType : poisoner->DamageType;
		}
		if(player->poisoncount > 100)
		{
			player->poisoncount = 100;
		}
	}
	return true;
}